

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O2

void Gia_ManObjSimAnd(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  word *pwVar2;
  word *pwVar3;
  word *pwVar4;
  ulong uVar5;
  ulong uVar6;
  
  pGVar1 = Gia_ManObj(p,iObj);
  pwVar2 = Gia_ManObjSim(p,iObj);
  pwVar3 = Gia_ManObjSim(p,iObj - (*(uint *)pGVar1 & 0x1fffffff));
  pwVar4 = Gia_ManObjSim(p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
  uVar6 = *(ulong *)pGVar1;
  uVar5 = 0;
  if (0 < p->nSimWords) {
    uVar5 = (ulong)(uint)p->nSimWords;
  }
  if (((uint)uVar6 >> 0x1d & 1) == 0) {
    if ((uVar6 >> 0x3d & 1) == 0) {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        pwVar2[uVar6] = pwVar4[uVar6] & pwVar3[uVar6];
      }
    }
    else {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        pwVar2[uVar6] = ~pwVar4[uVar6] & pwVar3[uVar6];
      }
    }
  }
  else if ((uVar6 >> 0x3d & 1) == 0) {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pwVar2[uVar6] = ~pwVar3[uVar6] & pwVar4[uVar6];
    }
  }
  else {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pwVar2[uVar6] = ~(pwVar4[uVar6] | pwVar3[uVar6]);
    }
  }
  return;
}

Assistant:

static inline void Gia_ManObjSimAnd( Gia_Man_t * p, int iObj )
{
    int w;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    word * pSim  = Gia_ManObjSim( p, iObj );
    word * pSim0 = Gia_ManObjSim( p, Gia_ObjFaninId0(pObj, iObj) );
    word * pSim1 = Gia_ManObjSim( p, Gia_ObjFaninId1(pObj, iObj) );
    if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = ~pSim0[w] & ~pSim1[w];
    else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = ~pSim0[w] & pSim1[w];
    else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = pSim0[w] & ~pSim1[w];
    else
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = pSim0[w] & pSim1[w];
}